

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcTangentsProcess.cpp
# Opt level: O0

void __thiscall Assimp::CalcTangentsProcess::Execute(CalcTangentsProcess *this,aiScene *pScene)

{
  bool bVar1;
  bool bVar2;
  Logger *pLVar3;
  uint local_20;
  uint a;
  bool bHas;
  aiScene *pScene_local;
  CalcTangentsProcess *this_local;
  
  if (pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/CalcTangentsProcess.cpp"
                  ,0x60,"virtual void Assimp::CalcTangentsProcess::Execute(aiScene *)");
  }
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"CalcTangentsProcess begin");
  bVar1 = false;
  for (local_20 = 0; local_20 < pScene->mNumMeshes; local_20 = local_20 + 1) {
    bVar2 = ProcessMesh(this,pScene->mMeshes[local_20],local_20);
    if (bVar2) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    pLVar3 = DefaultLogger::get();
    Logger::info(pLVar3,"CalcTangentsProcess finished. Tangents have been calculated");
  }
  else {
    pLVar3 = DefaultLogger::get();
    Logger::debug(pLVar3,"CalcTangentsProcess finished");
  }
  return;
}

Assistant:

void CalcTangentsProcess::Execute( aiScene* pScene)
{
    ai_assert( NULL != pScene );

    ASSIMP_LOG_DEBUG("CalcTangentsProcess begin");

    bool bHas = false;
    for ( unsigned int a = 0; a < pScene->mNumMeshes; a++ ) {
        if(ProcessMesh( pScene->mMeshes[a],a))bHas = true;
    }

    if ( bHas ) {
        ASSIMP_LOG_INFO("CalcTangentsProcess finished. Tangents have been calculated");
    } else {
        ASSIMP_LOG_DEBUG("CalcTangentsProcess finished");
    }
}